

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O3

void PrepareMapToPalette(uint32_t *palette,uint32_t num_colors,uint32_t *sorted,uint32_t *idx_map)

{
  uint uVar1;
  ulong uVar2;
  uint32_t uVar3;
  long lVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  ulong __nmemb;
  
  __nmemb = (ulong)num_colors;
  memcpy(sorted,palette,__nmemb * 4);
  qsort(sorted,__nmemb,4,PaletteCompareColorsForQsort);
  if (num_colors != 0) {
    uVar2 = 0;
    do {
      uVar1 = palette[uVar2];
      if (*sorted == uVar1) {
        lVar4 = 0;
      }
      else {
        uVar3 = 0;
        uVar5 = num_colors;
        do {
          uVar6 = (int)(uVar5 + uVar3) >> 1;
          lVar4 = (long)(int)uVar6;
          uVar7 = uVar6;
          if (sorted[lVar4] < uVar1) {
            uVar7 = uVar5;
            uVar3 = uVar6;
          }
          uVar5 = uVar7;
        } while (sorted[lVar4] != uVar1);
      }
      idx_map[lVar4] = (uint32_t)uVar2;
      uVar2 = uVar2 + 1;
    } while (uVar2 != __nmemb);
  }
  return;
}

Assistant:

void PrepareMapToPalette(const uint32_t palette[], uint32_t num_colors,
                         uint32_t sorted[], uint32_t idx_map[]) {
  uint32_t i;
  memcpy(sorted, palette, num_colors * sizeof(*sorted));
  qsort(sorted, num_colors, sizeof(*sorted), PaletteCompareColorsForQsort);
  for (i = 0; i < num_colors; ++i) {
    idx_map[SearchColorNoIdx(sorted, palette[i], num_colors)] = i;
  }
}